

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::BrandScope::BrandScope
          (BrandScope *this,ErrorReporter *errorReporter,uint64_t startingScopeId,
          uint startingScopeParamCount,Resolver *startingScope)

{
  uint *puVar1;
  Disposer *pDVar2;
  BrandScope *pBVar3;
  BrandScope *this_00;
  Refcounted *refcounted;
  char local_98 [8];
  uint64_t local_90;
  uint local_88;
  Resolver *local_70;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_002be380;
  this->errorReporter = errorReporter;
  (this->parent).ptr.disposer = (Disposer *)0x0;
  (this->parent).ptr.ptr = (BrandScope *)0x0;
  this->leafId = startingScopeId;
  this->leafParamCount = startingScopeParamCount;
  this->inherited = true;
  (this->params).ptr = (BrandedDecl *)0x0;
  (this->params).size_ = 0;
  (this->params).disposer = (ArrayDisposer *)0x0;
  (*startingScope->_vptr_Resolver[4])(local_98,startingScope);
  if (local_98[0] == '\x01') {
    this_00 = (BrandScope *)operator_new(0x50);
    BrandScope(this_00,errorReporter,local_90,local_88,local_70);
    puVar1 = &(this_00->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    pDVar2 = (this->parent).ptr.disposer;
    pBVar3 = (this->parent).ptr.ptr;
    (this->parent).ptr.disposer = (Disposer *)this_00;
    (this->parent).ptr.ptr = this_00;
    if (pBVar3 != (BrandScope *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pBVar3->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                        (long)&(pBVar3->super_Refcounted).super_Disposer._vptr_Disposer);
    }
  }
  return;
}

Assistant:

BrandScope(ErrorReporter& errorReporter, uint64_t startingScopeId,
             uint startingScopeParamCount, Resolver& startingScope)
      : errorReporter(errorReporter), parent(nullptr), leafId(startingScopeId),
        leafParamCount(startingScopeParamCount), inherited(true) {
    // Create all lexical parent scopes, all with no brand bindings.
    KJ_IF_MAYBE(p, startingScope.getParent()) {
      parent = kj::refcounted<BrandScope>(
          errorReporter, p->id, p->genericParamCount, *p->resolver);
    }
  }